

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

bool __thiscall
QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate *this,QFileSystemNode *node)

{
  Data *pDVar1;
  QRegularExpressionMatch *pQVar2;
  char cVar3;
  Type TVar4;
  anon_class_8_1_898f5b00_for__M_pred matchesNodeFileName;
  long lVar5;
  QRegularExpressionMatch *pQVar6;
  QRegularExpressionMatch *pQVar7;
  bool bVar8;
  
  if ((this->nameFilters).d.size == 0) {
    return true;
  }
  if (node->info == (QExtendedInformation *)0x0) {
    pDVar1 = (node->children).d;
    if (pDVar1 != (Data *)0x0) {
      bVar8 = 0 < (long)pDVar1->size;
      goto LAB_00621a8c;
    }
  }
  else {
    TVar4 = QExtendedInformation::type(node->info);
    bVar8 = TVar4 == Dir;
LAB_00621a8c:
    if ((bVar8) &&
       (((this->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
         super_QFlagsStorage<QDir::Filter>.i & 0x400) != 0)) {
      return true;
    }
  }
  pQVar6 = (QRegularExpressionMatch *)
           (this->nameFiltersRegexps).
           super__Vector_base<QRegularExpression,_std::allocator<QRegularExpression>_>._M_impl.
           super__Vector_impl_data._M_start;
  pQVar2 = (QRegularExpressionMatch *)
           (this->nameFiltersRegexps).
           super__Vector_base<QRegularExpression,_std::allocator<QRegularExpression>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pQVar2 - (long)pQVar6 >> 5;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      cVar3 = QString::contains((QRegularExpression *)node,pQVar6);
      pQVar7 = pQVar6;
      if (cVar3 != '\0') goto LAB_00621b86;
      cVar3 = QString::contains((QRegularExpression *)node,pQVar6 + 8);
      pQVar7 = pQVar6 + 8;
      if (cVar3 != '\0') goto LAB_00621b86;
      cVar3 = QString::contains((QRegularExpression *)node,pQVar6 + 0x10);
      pQVar7 = pQVar6 + 0x10;
      if (cVar3 != '\0') goto LAB_00621b86;
      cVar3 = QString::contains((QRegularExpression *)node,pQVar6 + 0x18);
      pQVar7 = pQVar6 + 0x18;
      if (cVar3 != '\0') goto LAB_00621b86;
      pQVar6 = pQVar6 + 0x20;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)pQVar2 - (long)pQVar6 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pQVar7 = pQVar2;
      if ((lVar5 != 3) ||
         (cVar3 = QString::contains((QRegularExpression *)node,pQVar6), pQVar7 = pQVar6,
         cVar3 != '\0')) goto LAB_00621b86;
      pQVar6 = pQVar6 + 8;
    }
    cVar3 = QString::contains((QRegularExpression *)node,pQVar6);
    pQVar7 = pQVar6;
    if (cVar3 != '\0') goto LAB_00621b86;
    pQVar6 = pQVar6 + 8;
  }
  cVar3 = QString::contains((QRegularExpression *)node,pQVar6);
  pQVar7 = pQVar6;
  if (cVar3 == '\0') {
    pQVar7 = pQVar2;
  }
LAB_00621b86:
  return pQVar7 != pQVar2;
}

Assistant:

bool QFileSystemModelPrivate::passNameFilters(const QFileSystemNode *node) const
{
#if QT_CONFIG(regularexpression)
    if (nameFilters.isEmpty())
        return true;

    // Check the name regularexpression filters
    if (!(node->isDir() && (filters & QDir::AllDirs))) {
        const auto matchesNodeFileName = [node](const QRegularExpression &re)
        {
            return node->fileName.contains(re);
        };
        return std::any_of(nameFiltersRegexps.begin(),
                           nameFiltersRegexps.end(),
                           matchesNodeFileName);
    }
#else
    Q_UNUSED(node);
#endif
    return true;
}